

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O2

void __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinhId>_>
::ClipFuncGraphDomain
          (BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinhId>_>
           *this)

{
  double *args_1;
  PLApproxParams *pPVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  Error *this_00;
  undefined4 extraout_var;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  Range rngAcc;
  undefined8 local_50;
  FuncGraphDomain local_48;
  
  (*this->_vptr_BasicPLApproximator[3])();
  rngAcc.lb = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  pPVar1 = this->laPrm_;
  args_1 = &(pPVar1->grDom).ubx;
  if (((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) <= (pPVar1->grDom).lbx) &&
     (*args_1 <= (double)CONCAT44(in_XMM1_Db,in_XMM1_Da))) {
    (*this->_vptr_BasicPLApproximator[4])(&local_48,this);
    FuncGraphDomain::intersect(&pPVar1->grDom,&local_48);
    iVar5 = (*this->_vptr_BasicPLApproximator[5])(this);
    if ((char)iVar5 != '\0') {
      (*this->_vptr_BasicPLApproximator[0x1e])(this,this->laPrm_);
    }
    this->lbx_ = (pPVar1->grDom).lbx;
    this->ubx_ = (pPVar1->grDom).ubx;
    pPVar1 = this->laPrm_;
    dVar2 = (pPVar1->grDom).lbx;
    dVar3 = (pPVar1->grDom).ubx;
    dVar4 = (pPVar1->grDom).uby;
    (pPVar1->grDomOut).lby = (pPVar1->grDom).lby;
    (pPVar1->grDomOut).uby = dVar4;
    (pPVar1->grDomOut).lbx = dVar2;
    (pPVar1->grDomOut).ubx = dVar3;
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x18);
  iVar5 = (*this->_vptr_BasicPLApproximator[2])(this);
  local_50 = CONCAT44(extraout_var,iVar5);
  fmt::format<char_const*,double,double,double,double>
            ((string *)&local_48,
             (fmt *)"PLApproximator<{}>: argument range [{}, {}] outside of the accepted [{}, {}]",
             (CStringRef)&local_50,(char **)pPVar1,args_1,&rngAcc.lb,&rngAcc.ub,(double *)rngAcc.lb)
  ;
  Error::Error(this_00,(CStringRef)local_48.lbx,-1);
  __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

virtual void ClipFuncGraphDomain() {
    auto rngAcc = GetLargestAcceptedArgumentRange();
    auto& lbx = laPrm_.grDom.lbx;
    auto& ubx = laPrm_.grDom.ubx;
    MP_ASSERT_ALWAYS(lbx >= rngAcc.lb && rngAcc.ub >= ubx,
                     fmt::format(
                       "PLApproximator<{}>: argument range "
                       "[{}, {}] outside of the accepted [{}, {}]",
                       GetConTypeName(),
                       lbx, ubx, rngAcc.lb, rngAcc.ub));
    laPrm_.grDom.intersect(GetFuncGraphDomain());
    if (IsMonotone())     // TODO in the reduced domain only
      ClipWithFunctionValues(laPrm_.grDom);
    lbx_ = lbx;
    ubx_ = ubx;
    laPrm_.grDomOut = laPrm_.grDom;        // communicate new domain
  }